

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

void __thiscall Patch::delete_node(Patch *this,Node **node_to_delete)

{
  vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *this_00;
  pointer ppNVar1;
  Node *this_01;
  
  if (*node_to_delete != (Node *)0x0) {
    this_00 = &this->node_stack;
    ppNVar1 = (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl
        .super__Vector_impl_data._M_finish != ppNVar1) {
      (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppNVar1;
    }
    std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back(this_00,node_to_delete);
    while (ppNVar1 = (this->node_stack).
                     super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
          (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_start != ppNVar1) {
      this_01 = ppNVar1[-1];
      (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppNVar1 + -1;
      if (this_01->left != (Node *)0x0) {
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                  (this_00,&this_01->left);
      }
      if (this_01->right != (Node *)0x0) {
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                  (this_00,&this_01->right);
      }
      Node::~Node(this_01);
      operator_delete(this_01,0x50);
      this->change_count = this->change_count - 1;
    }
    *node_to_delete = (Node *)0x0;
  }
  return;
}

Assistant:

void Patch::delete_node(Node **node_to_delete) {
  if (*node_to_delete) {
    node_stack.clear();
    node_stack.push_back(*node_to_delete);

    while (!node_stack.empty()) {
      Node *node = node_stack.back();
      node_stack.pop_back();
      if (node->left)
        node_stack.push_back(node->left);
      if (node->right)
        node_stack.push_back(node->right);
      delete node;
      change_count--;
    }

    *node_to_delete = nullptr;
  }
}